

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::resetScaleFactors
          (BeagleCPUImpl<double,_1,_1> *this,int cumulativeScalingIndex)

{
  int in_ESI;
  long in_RDI;
  
  if ((*(ulong *)(in_RDI + 0x58) & 0x80) == 0) {
    memset(*(void **)(*(long *)(in_RDI + 0xc0) + (long)in_ESI * 8),0,
           (long)*(int *)(in_RDI + 0x18) << 3);
  }
  else {
    memset(*(void **)(*(long *)(in_RDI + 0xc0) + (long)in_ESI * 8),0,
           (long)*(int *)(in_RDI + 0x18) << 1);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::resetScaleFactors(int cumulativeScalingIndex) {
    //memcpy(gScaleBuffers[cumulativeScalingIndex],zeros,sizeof(double) * kPatternCount);

     if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
         memset(gScaleBuffers[cumulativeScalingIndex], 0, sizeof(signed short) * kPaddedPatternCount);
     } else {
         memset(gScaleBuffers[cumulativeScalingIndex], 0, sizeof(REALTYPE) * kPaddedPatternCount);
     }
    return BEAGLE_SUCCESS;
}